

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

void tcp_recv_cb(ev_loop *loop,ev_io *w,int revents)

{
  ushort uVar1;
  uint uVar2;
  ssize_t sVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  char local_2048 [8];
  char buffer [8192];
  sockaddr local_40;
  
  sVar3 = recv(w[-1].fd,local_2048,0x5e8,0);
  if ((int)sVar3 < 1) {
    remove_relay_ctx(loop,(relay_ctx_t *)&w[-1].fd);
  }
  else {
    ev_timer_again(loop,(ev_timer *)(w + 2));
    ezbuf_put(*(ezbuf_t **)(w + 3),local_2048,(int)sVar3);
    local_40.sa_data[6] = '\0';
    local_40.sa_data[7] = '\0';
    local_40.sa_data[8] = '\0';
    local_40.sa_data[9] = '\0';
    local_40.sa_data[10] = '\0';
    local_40.sa_data[0xb] = '\0';
    local_40.sa_data[0xc] = '\0';
    local_40.sa_data[0xd] = '\0';
    local_40.sa_family = 2;
    uVar1 = *(ushort *)(*(long *)&w[4].fd + 0x44);
    local_40.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
    local_40.sa_data._2_4_ = inet_addr((char *)(*(long *)&w[4].fd + 0x20));
    sVar6 = 0x5e8;
    while( true ) {
      sVar4 = ezbuf_size(*(ezbuf_t **)(w + 3));
      if (sVar4 < (ulong)(long)(int)sVar6) break;
      sVar6 = ezbuf_get(*(ezbuf_t **)(w + 3),local_2048,(int)sVar6);
      uVar2 = unpack(local_2048,(int)sVar6,local_2048);
      pcVar5 = inet_ntoa((in_addr)*(in_addr_t *)((long)&w[3].data + 4));
      vlog("[tcp] recv(%d) from %s:%d\n",(ulong)uVar2,pcVar5);
      sendto(*(int *)((long)&w[3].next + 4),local_2048,(long)(int)uVar2,0,&local_40,0x10);
    }
  }
  return;
}

Assistant:

static void tcp_recv_cb(EV_P_ ev_io *w, int revents)
{
    int rx, bsize;
    char buffer[EZBUF_MAX];
    struct sockaddr_in saddr;
    socklen_t saddr_len;

    relay_ctx_t *relay_ctx;
    relay_ctx = obj_entry(w, relay_ctx_t, recv_io);

    bsize = sizeof(package_t);

    rx = recv(relay_ctx->tcp_fd, buffer, bsize, 0);
    if (rx <= 0)
    {
        remove_relay_ctx(EV_A, relay_ctx);
        return;
    }

    ev_timer_again(EV_A_ &relay_ctx->timeout);

    ezbuf_put(relay_ctx->recv_buf, buffer, rx);

    memset(&saddr, 0, sizeof(saddr));
    saddr.sin_family = AF_INET;
    saddr.sin_port = htons(relay_ctx->cfg->serv_port);;
    saddr.sin_addr.s_addr = inet_addr(relay_ctx->cfg->serv_addr);
    saddr_len = sizeof(saddr);

    while(1){
        if (ezbuf_size(relay_ctx->recv_buf) < bsize)
            break;

        bsize = ezbuf_get(relay_ctx->recv_buf, buffer, bsize);
        rx = unpack(buffer, bsize, buffer);
        vlog("[tcp] recv(%d) from %s:%d\n", rx, inet_ntoa(relay_ctx->src_addr.sin_addr), ntohs(relay_ctx->src_addr.sin_port));

        sendto(
            relay_ctx->udp_fd,
            buffer,
            rx,
            0,
            (struct sockaddr *)&saddr,
            saddr_len
        );
    }
}